

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void failure_suite::fail_minus(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_00;
  error *ex;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_28,"-",&local_29);
  std::allocator<char>::~allocator(&local_29);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&ex,(json *)local_28,input_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex);
  trial::protocol::core::detail::throw_failed_impl
            ("json::parse(input)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x236,"void failure_suite::fail_minus()");
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void fail_minus()
{
    std::string input = "-";
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::parse(input),
                                    json::error,
                                    "unexpected token");
}